

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_auth(Curl_easy *data,char *mech,bufref *initresp)

{
  anon_union_280_8_fcbf97e8_for_proto *pp;
  uchar *puVar1;
  char *ir;
  pop3_conn *pop3c;
  CURLcode result;
  bufref *initresp_local;
  char *mech_local;
  Curl_easy *data_local;
  
  pp = &data->conn->proto;
  puVar1 = Curl_bufref_ptr(initresp);
  if (puVar1 == (uchar *)0x0) {
    pop3c._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",mech);
  }
  else {
    pop3c._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s %s",mech,puVar1);
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_perform_auth(struct Curl_easy *data,
                                  const char *mech,
                                  const struct bufref *initresp)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &data->conn->proto.pop3c;
  const char *ir = (const char *) Curl_bufref_ptr(initresp);

  if(ir) {                                  /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(data, &pop3c->pp, "AUTH %s %s", mech, ir);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(data, &pop3c->pp, "AUTH %s", mech);
  }

  return result;
}